

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O2

QpAsmStatus
solveqp_actual(Instance *instance,Settings *settings,QpHotstartInformation *startinfo,
              Statistics *stats,QpModelStatus *status,QpSolution *solution,HighsTimer *qp_timer)

{
  Runtime rt;
  Basis basis;
  Quass local_15d0;
  _Vector_base<int,_std::allocator<int>_> local_15c8;
  _Vector_base<BasisStatus,_std::allocator<BasisStatus>_> local_15b0;
  _Vector_base<int,_std::allocator<int>_> local_1598;
  Runtime local_1580;
  Basis local_b88;
  
  Runtime::Runtime(&local_1580,instance,stats);
  Settings::operator=(&local_1580.settings,settings);
  Quass::Quass(&local_15d0,&local_1580);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1598,&startinfo->active);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)&local_15b0,&startinfo->status);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_15c8,&startinfo->inactive);
  Basis::Basis(&local_b88,&local_1580,(vector<int,_std::allocator<int>_> *)&local_1598,
               (vector<BasisStatus,_std::allocator<BasisStatus>_> *)&local_15b0,
               (vector<int,_std::allocator<int>_> *)&local_15c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_15c8);
  std::_Vector_base<BasisStatus,_std::allocator<BasisStatus>_>::~_Vector_base(&local_15b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1598);
  Quass::solve(&local_15d0,&startinfo->primal,&startinfo->rowact,&local_b88,qp_timer);
  *status = local_1580.status;
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (&solution->status_var,&local_1580.status_var);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (&solution->status_con,&local_1580.status_con);
  QpVector::operator=(&solution->primal,&local_1580.primal);
  QpVector::operator=(&solution->dualvar,&local_1580.dualvar);
  QpVector::operator=(&solution->rowactivity,&local_1580.rowactivity);
  QpVector::operator=(&solution->dualcon,&local_1580.dualcon);
  Basis::~Basis(&local_b88);
  Runtime::~Runtime(&local_1580);
  return kOk;
}

Assistant:

QpAsmStatus solveqp_actual(Instance& instance, Settings& settings,
                           QpHotstartInformation& startinfo, Statistics& stats,
                           QpModelStatus& status, QpSolution& solution,
                           HighsTimer& qp_timer) {
  Runtime rt(instance, stats);
  rt.settings = settings;
  Quass quass(rt);

  Basis basis(rt, startinfo.active, startinfo.status, startinfo.inactive);

  quass.solve(startinfo.primal, startinfo.rowact, basis, qp_timer);

  status = rt.status;

  solution.status_var = rt.status_var;
  solution.status_con = rt.status_con;
  solution.primal = rt.primal;
  solution.dualvar = rt.dualvar;
  solution.rowactivity = rt.rowactivity;
  solution.dualcon = rt.dualcon;

  return QpAsmStatus::kOk;
}